

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsSecondPartialDerivativeWRTStateControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  element_type *peVar6;
  ostream *poVar7;
  string *psVar8;
  char *pcVar9;
  ulong in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>
  *cost;
  iterator __end2;
  iterator __begin2;
  CostsMap *__range2;
  bool first;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffac8;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffad0;
  TimeRange *in_stack_fffffffffffffad8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffae8;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffaf0;
  ostringstream *this_00;
  MatrixDynSize *in_stack_fffffffffffffaf8;
  StorageBaseType *in_stack_fffffffffffffb10;
  double *in_stack_fffffffffffffb18;
  string local_398 [32];
  ostringstream local_378 [376];
  string local_200 [48];
  ostringstream local_1d0 [376];
  reference local_58;
  _Self local_50;
  _Self local_48;
  long local_40;
  byte local_31;
  ulong local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  lVar3 = iDynTree::MatrixDynSize::rows();
  lVar4 = iDynTree::VectorDynSize::size();
  if (lVar3 == lVar4) {
    lVar3 = iDynTree::MatrixDynSize::cols();
    lVar4 = iDynTree::VectorDynSize::size();
    if (lVar3 == lVar4) goto LAB_002fed6c;
  }
  uVar5 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize(local_30,uVar5);
LAB_002fed6c:
  local_31 = 1;
  local_40 = *in_RDI + 0x58;
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
                *)in_stack_fffffffffffffac8);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>_>
              *)in_stack_fffffffffffffac8);
  do {
    bVar1 = std::operator!=(&local_48,&local_50);
    if (!bVar1) {
      local_1 = 1;
LAB_002ff243:
      return (bool)(local_1 & 1);
    }
    local_58 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                            *)0x2fede0);
    bVar1 = TimeRange::isInRange(in_stack_fffffffffffffad8,(double)in_stack_fffffffffffffad0);
    if (bVar1) {
      peVar6 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2fee23);
      uVar2 = (*peVar6->_vptr_Cost[7])
                        (local_18,peVar6,local_20,local_28,&(local_58->second).mixedHessianBuffer);
      if ((uVar2 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar7 = std::operator<<((ostream *)local_1d0,"Error while evaluating cost ");
        peVar6 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2fee98);
        psVar8 = Cost::name_abi_cxx11_(peVar6);
        poVar7 = std::operator<<(poVar7,(string *)psVar8);
        std::operator<<(poVar7,".");
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError
                  ("OptimalControlProblem","costSecondPartialDerivativeWRTStateControl",pcVar9);
        std::__cxx11::string::~string(local_200);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
      }
      else {
        lVar3 = iDynTree::MatrixDynSize::rows();
        lVar4 = iDynTree::VectorDynSize::size();
        if (lVar3 == lVar4) {
          lVar3 = iDynTree::MatrixDynSize::cols();
          lVar4 = iDynTree::VectorDynSize::size();
          if (lVar3 == lVar4) {
            if ((local_31 & 1) == 0) {
              in_stack_fffffffffffffac8 =
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)&(local_58->second).weight;
              toEigen(in_stack_fffffffffffffaf8);
              Eigen::operator*(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
              toEigen(in_stack_fffffffffffffaf8);
              Eigen::
              MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
              operator+=(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
            }
            else {
              in_stack_fffffffffffffad0 =
                   (Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                   &(local_58->second).weight;
              toEigen(in_stack_fffffffffffffaf8);
              Eigen::operator*(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
              toEigen(in_stack_fffffffffffffaf8);
              Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
                        (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
              local_31 = 0;
            }
            goto LAB_002ff227;
          }
        }
        this_00 = local_378;
        std::__cxx11::ostringstream::ostringstream(this_00);
        poVar7 = std::operator<<((ostream *)this_00,"Error while evaluating ");
        peVar6 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2ff023);
        psVar8 = Cost::name_abi_cxx11_(peVar6);
        poVar7 = std::operator<<(poVar7,(string *)psVar8);
        poVar7 = std::operator<<(poVar7,": ");
        std::operator<<(poVar7,
                        "the hessian size is expected to have as many rows as the state dimension and a number of columns matching the control dimension."
                       );
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError
                  ("OptimalControlProblem","costSecondPartialDerivativeWRTStateControl",pcVar9);
        std::__cxx11::string::~string(local_398);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_378);
      }
      goto LAB_002ff243;
    }
LAB_002ff227:
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::optimalcontrol::TimedCost>_>
                  *)in_stack_fffffffffffffad0);
  } while( true );
}

Assistant:

bool OptimalControlProblem::costsSecondPartialDerivativeWRTStateControl(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &partialDerivative)
        {
            if ((partialDerivative.rows() != state.size()) || (partialDerivative.cols() != control.size())) {
                partialDerivative.resize(state.size(), control.size());
            }

            bool first = true;

            for (auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){

                    if (!cost.second.cost->costSecondPartialDerivativeWRTStateControl(time, state, control, cost.second.mixedHessianBuffer)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                        return false;
                    }

                    if ((cost.second.mixedHessianBuffer.rows() != state.size()) || (cost.second.mixedHessianBuffer.cols() != control.size())){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating " << cost.second.cost->name() <<": " << "the hessian size is expected to have as many rows as the state dimension and a number of columns matching the control dimension.";
                        reportError("OptimalControlProblem", "costSecondPartialDerivativeWRTStateControl", errorMsg.str().c_str());
                        return false;
                    }

                    if (first){
                        toEigen(partialDerivative) = cost.second.weight * toEigen(cost.second.mixedHessianBuffer);
                        first = false;
                    } else {
                        toEigen(partialDerivative) += cost.second.weight * toEigen(cost.second.mixedHessianBuffer);
                    }
                }
            }
            return true;
        }